

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O3

void rcg::anon_unknown_0::redraw
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,int *top_row,int focus_row,char *message)

{
  ushort uVar1;
  int iVar2;
  pointer pNVar3;
  int iVar4;
  char *str;
  int row;
  long lVar5;
  gcstring local_80 [80];
  
  if (_stdscr == 0) {
    erase();
    return;
  }
  uVar1 = *(ushort *)(_stdscr + 4);
  row = (int)(short)uVar1;
  erase();
  if (0 < row) {
    iVar2 = *top_row;
    iVar4 = focus_row;
    if (iVar2 < focus_row) {
      iVar4 = iVar2;
    }
    if ((focus_row < iVar2) || (iVar4 + row <= focus_row)) {
      if (iVar4 + row <= focus_row) {
        iVar4 = (focus_row + 1) - row;
      }
      *top_row = iVar4;
    }
    lVar5 = 0;
    do {
      iVar2 = *top_row;
      iVar4 = (int)lVar5;
      pNVar3 = (list->
               super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar2 + iVar4 <
          (int)((ulong)((long)(list->
                              super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3) >> 4)) {
        redraw_line(iVar4,pNVar3 + iVar2 + lVar5,focus_row - iVar2 == iVar4,
                    SUB41(focus_row - iVar2,0));
      }
      lVar5 = lVar5 + 1;
    } while ((uint)uVar1 != (uint)lVar5);
    if ((message != (char *)0x0) && (*message != '\0')) {
      mvaddstr_eol(row,0,message,true);
      return;
    }
    (**(code **)(*(long *)(list->
                          super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                          )._M_impl.super__Vector_impl_data._M_start[focus_row].node + 0x58))
              (local_80);
    str = (char *)GenICam_3_4::gcstring::c_str();
    mvaddstr_eol(row,0,str,true);
    GenICam_3_4::gcstring::~gcstring(local_80);
  }
  return;
}

Assistant:

void redraw(std::vector<NodeParam> &list, int &top_row, int focus_row, const char *message=0)
{
  int rows=getmaxy(stdscr);

  erase();

  if (rows > 1)
  {
    rows--; // last row is used for showing tool tips and errors

    // focus row must always be visible

    if (focus_row < top_row) top_row=focus_row;
    if (focus_row > top_row+rows-1) top_row=focus_row-rows+1;

    // print all visible rows

    for (int i=0; i<rows; i++)
    {
      if (top_row+i < static_cast<int>(list.size()))
      {
        redraw_line(i, list[top_row+i], focus_row == top_row+i);
      }
    }

    if (message && *message != '\0')
    {
      mvaddstr_eol(rows, 0, message, true);
    }
    else
    {
      list[focus_row].printTooltip(rows, true);
    }
  }
}